

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

Matcher<const_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_johnor[P]n_e_s_vis_build_O0__deps_nes_core_src_core_test_src_test_rom_cpp:79:5)_&>
* testing::internal::
  MatcherCastImpl<const_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_rom.cpp:79:5)_&,_testing::PolymorphicMatcher<testing::internal::ExceptionMatcherImpl<std::logic_error>_>_>
  ::CastImpl<false>(Matcher<const_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_johnor[P]n_e_s_vis_build_O0__deps_nes_core_src_core_test_src_test_rom_cpp:79:5)_&>
                    *__return_storage_ptr__,PolymorphicMatcher *polymorphic_matcher_or_value)

{
  PolymorphicMatcher<testing::internal::ExceptionMatcherImpl<std::logic_error>_>
  *polymorphic_matcher_or_value_local;
  
  PolymorphicMatcher::operator_cast_to_Matcher(__return_storage_ptr__,polymorphic_matcher_or_value);
  return __return_storage_ptr__;
}

Assistant:

static Matcher<T> CastImpl(const M& polymorphic_matcher_or_value,
                             std::true_type /* convertible_to_matcher */,
                             std::integral_constant<bool, Ignore>) {
    // M is implicitly convertible to Matcher<T>, which means that either
    // M is a polymorphic matcher or Matcher<T> has an implicit constructor
    // from M.  In both cases using the implicit conversion will produce a
    // matcher.
    //
    // Even if T has an implicit constructor from M, it won't be called because
    // creating Matcher<T> would require a chain of two user-defined conversions
    // (first to create T from M and then to create Matcher<T> from T).
    return polymorphic_matcher_or_value;
  }